

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_create_editor(_glist *x)

{
  t_editor *ptVar1;
  t_object *who;
  t_object *ob;
  t_gobj *y;
  _glist *x_local;
  
  if (x->gl_editor == (t_editor *)0x0) {
    ptVar1 = editor_new(x);
    x->gl_editor = ptVar1;
    for (ob = (t_object *)x->gl_list; ob != (t_object *)0x0; ob = (t_object *)(ob->te_g).g_next) {
      who = pd_checkobject((t_pd *)ob);
      if (who != (t_object *)0x0) {
        rtext_new(x,who);
      }
    }
  }
  return;
}

Assistant:

void canvas_create_editor(t_glist *x)
{
    t_gobj *y;
    t_object *ob;
    if (!x->gl_editor)
    {
        x->gl_editor = editor_new(x);
        for (y = x->gl_list; y; y = y->g_next)
            if ((ob = pd_checkobject(&y->g_pd)))
                rtext_new(x, ob);
    }
}